

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O0

vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> * __thiscall
libcalc::Tokenizer::toRPN
          (vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *__return_storage_ptr__,
          Tokenizer *this)

{
  bool bVar1;
  reference ppTVar2;
  reference ppTVar3;
  bool local_19f;
  bool local_14a;
  bool local_13c;
  bool local_ca;
  bool local_bc;
  Token *local_a0;
  Token *t;
  iterator __end1;
  iterator __begin1;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *__range1;
  undefined1 local_70 [8];
  stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_> op;
  Tokenizer *this_local;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *rpn;
  
  op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
  std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::vector(__return_storage_ptr__);
  std::stack<libcalc::Token*,std::deque<libcalc::Token*,std::allocator<libcalc::Token*>>>::
  stack<std::deque<libcalc::Token*,std::allocator<libcalc::Token*>>,void>
            ((stack<libcalc::Token*,std::deque<libcalc::Token*,std::allocator<libcalc::Token*>>> *)
             local_70);
  __end1 = std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::begin(&this->tokens);
  t = (Token *)std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::end(&this->tokens);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                     *)&t), bVar1) {
    ppTVar2 = __gnu_cxx::
              __normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
              ::operator*(&__end1);
    local_a0 = *ppTVar2;
    if (local_a0->type == '\x01') {
      bVar1 = std::operator==(&local_a0->value,"+");
      if ((bVar1) || (bVar1 = std::operator==(&local_a0->value,"-"), bVar1)) {
        while( true ) {
          bVar1 = std::
                  stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                  ::empty((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                           *)local_70);
          local_bc = false;
          if (!bVar1) {
            ppTVar3 = std::
                      stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                      ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                             *)local_70);
            bVar1 = std::operator==(&(*ppTVar3)->value,"-");
            local_ca = true;
            if (!bVar1) {
              ppTVar3 = std::
                        stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                        ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                               *)local_70);
              bVar1 = std::operator==(&(*ppTVar3)->value,"+");
              local_ca = true;
              if (!bVar1) {
                ppTVar3 = std::
                          stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                          ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                 *)local_70);
                bVar1 = std::operator==(&(*ppTVar3)->value,"*");
                local_ca = true;
                if (!bVar1) {
                  ppTVar3 = std::
                            stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                            ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                   *)local_70);
                  bVar1 = std::operator==(&(*ppTVar3)->value,"/");
                  local_ca = true;
                  if (!bVar1) {
                    ppTVar3 = std::
                              stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                              ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                     *)local_70);
                    bVar1 = std::operator==(&(*ppTVar3)->value,"%");
                    local_ca = true;
                    if (!bVar1) {
                      ppTVar3 = std::
                                stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                       *)local_70);
                      bVar1 = std::operator==(&(*ppTVar3)->value,"!");
                      local_ca = true;
                      if (!bVar1) {
                        ppTVar3 = std::
                                  stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                  ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                         *)local_70);
                        local_ca = std::operator==(&(*ppTVar3)->value,"^");
                      }
                    }
                  }
                }
              }
            }
            local_bc = local_ca;
          }
          if (local_bc == false) break;
          ppTVar3 = std::
                    stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                    ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                           *)local_70);
          std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                    (__return_storage_ptr__,ppTVar3);
          std::
          stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
          ::pop((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                 *)local_70);
        }
        std::
        stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>::
        push((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
              *)local_70,&local_a0);
      }
      else {
        bVar1 = std::operator==(&local_a0->value,"*");
        if ((bVar1) || (bVar1 = std::operator==(&local_a0->value,"/"), bVar1)) {
          while( true ) {
            bVar1 = std::
                    stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                    ::empty((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                             *)local_70);
            local_13c = false;
            if (!bVar1) {
              ppTVar3 = std::
                        stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                        ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                               *)local_70);
              bVar1 = std::operator==(&(*ppTVar3)->value,"*");
              local_14a = true;
              if (!bVar1) {
                ppTVar3 = std::
                          stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                          ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                 *)local_70);
                bVar1 = std::operator==(&(*ppTVar3)->value,"/");
                local_14a = true;
                if (!bVar1) {
                  ppTVar3 = std::
                            stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                            ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                   *)local_70);
                  bVar1 = std::operator==(&(*ppTVar3)->value,"%");
                  local_14a = true;
                  if (!bVar1) {
                    ppTVar3 = std::
                              stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                              ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                     *)local_70);
                    bVar1 = std::operator==(&(*ppTVar3)->value,"!");
                    local_14a = true;
                    if (!bVar1) {
                      ppTVar3 = std::
                                stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                       *)local_70);
                      local_14a = std::operator==(&(*ppTVar3)->value,"^");
                    }
                  }
                }
              }
              local_13c = local_14a;
            }
            if (local_13c == false) break;
            ppTVar3 = std::
                      stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                      ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                             *)local_70);
            std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                      (__return_storage_ptr__,ppTVar3);
            std::
            stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
            ::pop((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                   *)local_70);
          }
          std::
          stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
          ::push((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                  *)local_70,&local_a0);
        }
        else {
          bVar1 = std::operator==(&local_a0->value,"(");
          if ((((bVar1) || (bVar1 = std::operator==(&local_a0->value,"^"), bVar1)) ||
              (bVar1 = std::operator==(&local_a0->value,"%"), bVar1)) ||
             (bVar1 = std::operator==(&local_a0->value,"!"), bVar1)) {
            std::
            stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
            ::push((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                    *)local_70,&local_a0);
          }
          else {
            bVar1 = std::operator==(&local_a0->value,")");
            if (bVar1) {
              while( true ) {
                bVar1 = std::
                        stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                        ::empty((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                 *)local_70);
                local_19f = false;
                if (!bVar1) {
                  ppTVar3 = std::
                            stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                            ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                   *)local_70);
                  local_19f = std::operator!=(&(*ppTVar3)->value,"(");
                }
                if (local_19f == false) break;
                ppTVar3 = std::
                          stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                          ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                 *)local_70);
                std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                          (__return_storage_ptr__,ppTVar3);
                std::
                stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                ::pop((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                       *)local_70);
              }
              std::
              stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
              ::pop((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                     *)local_70);
            }
          }
        }
      }
    }
    else {
      std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                (__return_storage_ptr__,&local_a0);
    }
    __gnu_cxx::
    __normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
    ::operator++(&__end1);
  }
  while (bVar1 = std::
                 stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                 ::empty((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                          *)local_70), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppTVar3 = std::
              stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
              ::top((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                     *)local_70);
    std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
              (__return_storage_ptr__,ppTVar3);
    std::stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>::
    pop((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_> *
        )local_70);
  }
  op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._7_1_ = 1;
  std::stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>::
  ~stack((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
          *)local_70);
  if ((op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node._7_1_ & 1) == 0) {
    std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token *> Tokenizer::toRPN() {
  std::vector<Token *> rpn;
  std::stack<Token *> op;

  for (auto t : tokens) {
    if (t->type != TOKEN_TYPE.OPERATOR) {
      rpn.push_back(t);
      continue;
    } else if (t->value == "+" || t->value == "-") {

        while( !op.empty() &&
            (op.top()->value == "-" ||
             op.top()->value == "+" ||
             op.top()->value == "*" ||
             op.top()->value == "/" ||
             op.top()->value == "%" ||
             op.top()->value == "!" ||
             op.top()->value == "^" )) {

          rpn.push_back(op.top());
          op.pop();
        }

        op.push(t);

    } else if (t->value == "*" || t->value == "/") {

        while( !op.empty() &&
            (op.top()->value == "*" ||
             op.top()->value == "/" ||
             op.top()->value == "%" ||
             op.top()->value == "!" ||
             op.top()->value == "^" )) {

          rpn.push_back(op.top());
          op.pop();
        }
        op.push(t);

    } else if (t->value == "(" ||
               t->value == "^" ||
               t->value == "%" ||
               t->value == "!") {

      op.push(t);

    } else if (t->value == ")") {
      while (!op.empty() && op.top()->value != "(") {
        rpn.push_back(op.top());
        op.pop();
      }
      op.pop();
    }
  }

  while(!op.empty()) {
    rpn.push_back(op.top());
    op.pop();
  }

  return rpn;
}